

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void uv__run_pending(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__queue pq;
  uv__queue local_20;
  
  local_20.next = (loop->pending_queue).next;
  if (local_20.next != &loop->pending_queue) {
    local_20.prev = (loop->pending_queue).prev;
    (local_20.prev)->next = &local_20;
    puVar1 = (local_20.next)->prev;
    (loop->pending_queue).prev = puVar1;
    puVar1->next = &loop->pending_queue;
    (local_20.next)->prev = &local_20;
    while (local_20.next != &local_20) {
      puVar1 = (local_20.next)->next;
      (local_20.next)->prev->next = puVar1;
      puVar1->prev = (local_20.next)->prev;
      (local_20.next)->next = local_20.next;
      (local_20.next)->prev = local_20.next;
      (*(code *)local_20.next[-1].prev)(loop,&local_20.next[-1].prev,4);
    }
  }
  return;
}

Assistant:

static void uv__run_pending(uv_loop_t* loop) {
  struct uv__queue* q;
  struct uv__queue pq;
  uv__io_t* w;

  uv__queue_move(&loop->pending_queue, &pq);

  while (!uv__queue_empty(&pq)) {
    q = uv__queue_head(&pq);
    uv__queue_remove(q);
    uv__queue_init(q);
    w = uv__queue_data(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }
}